

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O1

int __thiscall
CVmObjFile::getp_setMode(CVmObjFile *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  byte bVar1;
  char *pcVar2;
  CVmNetFile *netfile;
  CVmDataSource *fp;
  unsigned_long flags;
  vm_datatype_t *pvVar3;
  vm_val_t *pvVar4;
  int iVar5;
  uint create_readbuf;
  vm_obj_id_t charset;
  uint uVar6;
  
  if (getp_setMode(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_setMode();
  }
  if (oargc == (uint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = *oargc;
  }
  iVar5 = CVmObject::get_prop_check_argc(retval,oargc,&getp_setMode::desc);
  if (iVar5 == 0) {
    check_valid_file(this);
    iVar5 = CVmBif::pop_int_val();
    pcVar2 = (this->super_CVmObject).ext_;
    netfile = *(CVmNetFile **)pcVar2;
    fp = *(CVmDataSource **)(pcVar2 + 8);
    flags = *(unsigned_long *)(pcVar2 + 0x18);
    bVar1 = pcVar2[0x15];
    if (iVar5 - 2U < 2) {
      create_readbuf = 0;
      if (2 < (int)uVar6) {
        sp_ = sp_ + -1;
      }
      charset = 0;
    }
    else {
      if (iVar5 != 1) {
        err_throw(0x902);
      }
      charset = get_charset_arg(0,uVar6 - 1);
      create_readbuf = (uint)(bVar1 == 1);
    }
    pvVar4 = sp_;
    if (charset == 0) {
      pvVar3 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar3 = VM_NIL;
    }
    else {
      pvVar3 = &sp_->typ;
      sp_ = sp_ + 1;
      *pvVar3 = VM_OBJ;
      (pvVar4->val).obj = charset;
    }
    pcVar2[0] = '\0';
    pcVar2[1] = '\0';
    pcVar2[2] = '\0';
    pcVar2[3] = '\0';
    pcVar2[4] = '\0';
    pcVar2[5] = '\0';
    pcVar2[6] = '\0';
    pcVar2[7] = '\0';
    pcVar2[8] = '\0';
    pcVar2[9] = '\0';
    pcVar2[10] = '\0';
    pcVar2[0xb] = '\0';
    pcVar2[0xc] = '\0';
    pcVar2[0xd] = '\0';
    pcVar2[0xe] = '\0';
    pcVar2[0xf] = '\0';
    alloc_ext(this,netfile,charset,fp,flags,iVar5,(uint)bVar1,create_readbuf);
    sp_ = sp_ + -(long)(int)uVar6;
  }
  return 1;
}

Assistant:

int CVmObjFile::getp_setMode(VMG_ vm_obj_id_t self, vm_val_t *retval,
                             uint *oargc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1, 1);
    int argc = (oargc != 0 ? *oargc : 0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;
    
    /* make sure we are allowed to perform operations on the file */
    check_valid_file(vmg0_);
    
    /* retrieve the mode argument */
    int mode = CVmBif::pop_int_val(vmg0_);
    --argc;

    /* presume no character set or read buffer */
    vm_obj_id_t cset = VM_INVALID_OBJ;
    int create_readbuf = FALSE;

    /* save the retained settings from the current extension */
    vmobjfile_ext_t *ext = get_ext();
    CVmDataSource *fp = ext->fp;
    CVmNetFile *netfile = ext->netfile;
    unsigned long flags = ext->flags;
    int access = ext->access;

    /* check the mode */
    switch (mode)
    {
    case VMOBJFILE_MODE_TEXT:
        /* text mode - we need a character mapper in this mode */
        cset = get_charset_arg(vmg_ 0, argc);

        /* 
         *   if we're open with read access, we need a read buffer in order
         *   to do the character set translation 
         */
        if (access == VMOBJFILE_ACCESS_READ)
            create_readbuf = TRUE;
        break;

    case VMOBJFILE_MODE_DATA:
    case VMOBJFILE_MODE_RAW:
        /* 
         *   data mode or raw mode - we don't use a character mapper for this
         *   mode, so if the argument is present, simply discard it 
         */
        if (argc >= 2)
            G_stk->discard();
        break;

    default:
        /* invalid mode */
        err_throw(VMERR_BAD_VAL_BIF);
    }
    
    /* push the character set object (if any) for gc protection */
    G_stk->push_obj_or_nil(vmg_ cset);

    /* 
     *   remove the data source and network file descriptor from the
     *   extension, so that they're not deleted when we reallocate it 
     */
    ext->fp = 0;
    ext->netfile = 0;

    /* 
     *   Reallocate the extension.  This will set up the correct structures
     *   for the new file mode. 
     */
    alloc_ext(vmg_ netfile, cset, fp, flags, mode, access, create_readbuf);

    /* discard arguments and gc protection */
    G_stk->discard(argc + 1);

    /* handled */
    return TRUE;
}